

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

ExprModule * AnalyzeModuleFromSource(CompilerContext *ctx)

{
  CompilerStatistics *this;
  uint uVar1;
  int iVar2;
  SynModule *pSVar3;
  void *pvVar4;
  size_t sVar5;
  ExprModule *pEVar6;
  char *pcVar7;
  ParseGraphContext parseGraphCtx;
  TraceScope traceScope;
  TraceScope traceScope_1;
  TraceScope local_68;
  TraceScope local_58;
  ExpressionGraphContext local_48;
  
  if (AnalyzeModuleFromSource(CompilerContext&)::token == '\0') {
    iVar2 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token);
    if (iVar2 != 0) {
      AnalyzeModuleFromSource::token = NULLC::TraceGetToken("compiler","AnalyzeModuleFromSource");
      __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_58,AnalyzeModuleFromSource::token);
  (ctx->parseCtx).bytecodeBuilder = BuildModuleFromPath;
  (ctx->parseCtx).errorBuf = ctx->errorBuf;
  (ctx->parseCtx).errorBufSize = ctx->errorBufSize;
  pSVar3 = Parse(&ctx->parseCtx,ctx->code,ctx->moduleRoot);
  ctx->synModule = pSVar3;
  this = &ctx->statistics;
  CompilerStatistics::Add(this,&(ctx->parseCtx).statistics);
  uVar1 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar1;
  (ctx->statistics).finishTime = 0;
  if ((ctx->enableLogFiles == true) && (ctx->synModule != (SynModule *)0x0)) {
    if (AnalyzeModuleFromSource(CompilerContext&)::token == '\0') {
      iVar2 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token);
      if (iVar2 != 0) {
        AnalyzeModuleFromSource(CompilerContext&)::token =
             NULLC::TraceGetToken("compiler","Debug::syntax_graph");
        __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
      }
    }
    NULLC::TraceScope::TraceScope
              ((TraceScope *)&local_48,AnalyzeModuleFromSource(CompilerContext&)::token);
    if ((ctx->outputCtx).stream != (void *)0x0) {
      __assert_fail("!ctx.outputCtx.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x1ad,"ExprModule *AnalyzeModuleFromSource(CompilerContext &)");
    }
    pvVar4 = (*(ctx->outputCtx).openStream)("syntax_graph.txt");
    (ctx->outputCtx).stream = pvVar4;
    if (pvVar4 != (void *)0x0) {
      local_68.ts = (double)&ctx->outputCtx;
      local_68.lastEventPos = 0;
      PrintGraph((ParseGraphContext *)&local_68,&ctx->synModule->super_SynBase,"");
      (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
      (ctx->outputCtx).stream = (void *)0x0;
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)&local_48);
  }
  uVar1 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Logging",uVar1);
  pSVar3 = ctx->synModule;
  if (pSVar3 == (SynModule *)0x0) {
    pcVar7 = (ctx->parseCtx).errorPos;
LAB_0024739b:
    if (pcVar7 != (char *)0x0) goto LAB_002473a0;
  }
  else {
    (ctx->exprCtx).memoryLimit = ctx->exprMemoryLimit;
    pcVar7 = ctx->errorBuf;
    (ctx->exprCtx).errorBuf = pcVar7;
    uVar1 = ctx->errorBufSize;
    (ctx->exprCtx).errorBufSize = uVar1;
    if ((ctx->parseCtx).errorPos != (char *)0x0) {
      sVar5 = strlen(pcVar7);
      (ctx->exprCtx).errorBuf = pcVar7 + (sVar5 & 0xffffffff);
      (ctx->exprCtx).errorBufSize = uVar1 - (int)sVar5;
    }
    pEVar6 = Analyze(&ctx->exprCtx,pSVar3,ctx->code,ctx->moduleRoot);
    ctx->exprModule = pEVar6;
    CompilerStatistics::Add(this,&(ctx->exprCtx).statistics);
    uVar1 = NULLCTime::clockMicro();
    (ctx->statistics).startTime = uVar1;
    (ctx->statistics).finishTime = 0;
    if ((ctx->enableLogFiles == true) && (ctx->exprModule != (ExprModule *)0x0)) {
      if (AnalyzeModuleFromSource(CompilerContext&)::token == '\0') {
        iVar2 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token);
        if (iVar2 != 0) {
          AnalyzeModuleFromSource(CompilerContext&)::token =
               NULLC::TraceGetToken("compiler","Debug::expr_graph");
          __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
        }
      }
      NULLC::TraceScope::TraceScope(&local_68,AnalyzeModuleFromSource(CompilerContext&)::token);
      if ((ctx->outputCtx).stream != (void *)0x0) {
        __assert_fail("!ctx.outputCtx.stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                      ,0x1e0,"ExprModule *AnalyzeModuleFromSource(CompilerContext &)");
      }
      pvVar4 = (*(ctx->outputCtx).openStream)("expr_graph.txt");
      (ctx->outputCtx).stream = pvVar4;
      if (pvVar4 != (void *)0x0) {
        local_48.output = &ctx->outputCtx;
        local_48.depth = 0;
        local_48.skipImported = false;
        local_48.skipFunctionDefinitions = false;
        local_48.ctx = &ctx->exprCtx;
        PrintGraph(&local_48,&ctx->exprModule->super_ExprBase,"");
        (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
        (ctx->outputCtx).stream = (void *)0x0;
      }
      NULLC::TraceScope::~TraceScope(&local_68);
    }
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(this,"Logging",uVar1);
    pEVar6 = ctx->exprModule;
    if (((pEVar6 != (ExprModule *)0x0) && ((ctx->exprCtx).errorCount == 0)) &&
       ((ctx->parseCtx).errorCount == 0)) goto LAB_002473a7;
    pcVar7 = (ctx->parseCtx).errorPos;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (ctx->exprCtx).errorPos;
      goto LAB_0024739b;
    }
LAB_002473a0:
    ctx->errorPos = pcVar7;
  }
  pEVar6 = (ExprModule *)0x0;
LAB_002473a7:
  NULLC::TraceScope::~TraceScope(&local_58);
  return pEVar6;
}

Assistant:

ExprModule* AnalyzeModuleFromSource(CompilerContext &ctx)
{
	TRACE_SCOPE("compiler", "AnalyzeModuleFromSource");

	ParseContext &parseCtx = ctx.parseCtx;

	parseCtx.bytecodeBuilder = BuildModuleFromPath;

	parseCtx.errorBuf = ctx.errorBuf;
	parseCtx.errorBufSize = ctx.errorBufSize;

	ctx.synModule = Parse(parseCtx, ctx.code, ctx.moduleRoot);

	ctx.statistics.Add(ctx.parseCtx.statistics);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles && ctx.synModule)
	{
		TRACE_SCOPE("compiler", "Debug::syntax_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("syntax_graph.txt");
		
		if(ctx.outputCtx.stream)
		{
			ParseGraphContext parseGraphCtx(ctx.outputCtx);

			PrintGraph(parseGraphCtx, ctx.synModule, "");

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	if(!ctx.synModule)
	{
		if(parseCtx.errorPos)
			ctx.errorPos = parseCtx.errorPos;

		return NULL;
	}

	//printf("# Parse memory %dkb\n", ctx.allocator->requested() / 1024);

	ExpressionContext &exprCtx = ctx.exprCtx;

	exprCtx.memoryLimit = ctx.exprMemoryLimit;

	exprCtx.errorBuf = ctx.errorBuf;
	exprCtx.errorBufSize = ctx.errorBufSize;

	if(parseCtx.errorPos)
	{
		unsigned errorLength = unsigned(strlen(exprCtx.errorBuf));

		exprCtx.errorBuf += errorLength;
		exprCtx.errorBufSize -= errorLength;
	}

	ctx.exprModule = Analyze(exprCtx, ctx.synModule, ctx.code, ctx.moduleRoot);

	ctx.statistics.Add(ctx.exprCtx.statistics);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles && ctx.exprModule)
	{
		TRACE_SCOPE("compiler", "Debug::expr_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("expr_graph.txt");

		if(ctx.outputCtx.stream)
		{
			ExpressionGraphContext exprGraphCtx(ctx.exprCtx, ctx.outputCtx);

			PrintGraph(exprGraphCtx, ctx.exprModule, "");

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	if(!ctx.exprModule || exprCtx.errorCount != 0 || parseCtx.errorCount != 0)
	{
		if(parseCtx.errorPos)
			ctx.errorPos = parseCtx.errorPos;
		else if(exprCtx.errorPos)
			ctx.errorPos = exprCtx.errorPos;

		return NULL;
	}

	//printf("# Compile memory %dkb\n", ctx.allocator->requested() / 1024);

	return ctx.exprModule;
}